

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementCableANCF.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChElementCableANCF::LoadableGetStateBlock_x
          (ChElementCableANCF *this,int block_offset,ChState *mD)

{
  element_type *peVar1;
  double *pdVar2;
  Index index;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  if ((-1 < block_offset) &&
     ((long)block_offset <=
      (mD->super_ChVectorDynamic<double>).
      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows + -3)) {
    pdVar2 = (mD->super_ChVectorDynamic<double>).
             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data +
             block_offset;
    uVar3 = 3;
    if ((((ulong)pdVar2 & 7) == 0) &&
       (uVar4 = (ulong)(-((uint)((ulong)pdVar2 >> 3) & 0x1fffffff) & 7), uVar4 < 3)) {
      uVar3 = uVar4;
    }
    peVar1 = (((this->nodes).
               super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
             super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    if (uVar3 != 0) {
      uVar4 = 0;
      do {
        pdVar2[uVar4] = *(double *)((long)&peVar1->super_ChNodeFEAxyz + uVar4 * 8 + 0x20);
        uVar4 = uVar4 + 1;
      } while (uVar3 != uVar4);
    }
    if (uVar3 < 3) {
      do {
        pdVar2[uVar3] = *(double *)((long)&peVar1->super_ChNodeFEAxyz + uVar3 * 8 + 0x20);
        uVar3 = uVar3 + 1;
      } while (uVar3 != 3);
    }
    uVar3 = (ulong)(uint)block_offset;
    if ((long)(uVar3 + 3) <=
        (mD->super_ChVectorDynamic<double>).
        super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows + -3) {
      pdVar2 = (mD->super_ChVectorDynamic<double>).
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data +
               uVar3 + 3;
      uVar4 = 3;
      if ((((ulong)pdVar2 & 7) == 0) &&
         (uVar5 = (ulong)(-((uint)((ulong)pdVar2 >> 3) & 0x1fffffff) & 7), uVar5 < 3)) {
        uVar4 = uVar5;
      }
      peVar1 = (((this->nodes).
                 super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->
               super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      if (uVar4 != 0) {
        uVar5 = 0;
        do {
          pdVar2[uVar5] = *(double *)((long)&peVar1->D_dt + uVar5 * 8 + 0xffffffffffffffe8);
          uVar5 = uVar5 + 1;
        } while (uVar4 != uVar5);
      }
      if (uVar4 < 3) {
        do {
          pdVar2[uVar4] = *(double *)((long)&peVar1->D_dt + uVar4 * 8 + 0xffffffffffffffe8);
          uVar4 = uVar4 + 1;
        } while (uVar4 != 3);
      }
      if ((long)(uVar3 + 6) <=
          (mD->super_ChVectorDynamic<double>).
          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows + -3) {
        pdVar2 = (mD->super_ChVectorDynamic<double>).
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data +
                 uVar3 + 6;
        uVar4 = 3;
        if ((((ulong)pdVar2 & 7) == 0) &&
           (uVar5 = (ulong)(-((uint)((ulong)pdVar2 >> 3) & 0x1fffffff) & 7), uVar5 < 3)) {
          uVar4 = uVar5;
        }
        peVar1 = (this->nodes).
                 super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[1].
                 super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (uVar4 != 0) {
          uVar5 = 0;
          do {
            pdVar2[uVar5] = *(double *)((long)&peVar1->super_ChNodeFEAxyz + uVar5 * 8 + 0x20);
            uVar5 = uVar5 + 1;
          } while (uVar4 != uVar5);
        }
        if (uVar4 < 3) {
          do {
            pdVar2[uVar4] = *(double *)((long)&peVar1->super_ChNodeFEAxyz + uVar4 * 8 + 0x20);
            uVar4 = uVar4 + 1;
          } while (uVar4 != 3);
        }
        if ((long)(uVar3 + 9) <=
            (mD->super_ChVectorDynamic<double>).
            super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows + -3) {
          pdVar2 = (mD->super_ChVectorDynamic<double>).
                   super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data +
                   uVar3 + 9;
          uVar3 = 3;
          if ((((ulong)pdVar2 & 7) == 0) &&
             (uVar4 = (ulong)(-((uint)((ulong)pdVar2 >> 3) & 0x1fffffff) & 7), uVar4 < 3)) {
            uVar3 = uVar4;
          }
          peVar1 = (this->nodes).
                   super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[1].
                   super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>._M_ptr
          ;
          if (uVar3 != 0) {
            uVar4 = 0;
            do {
              pdVar2[uVar4] = *(double *)((long)&peVar1->D_dt + uVar4 * 8 + 0xffffffffffffffe8);
              uVar4 = uVar4 + 1;
            } while (uVar3 != uVar4);
          }
          if (uVar3 < 3) {
            do {
              pdVar2[uVar3] = *(double *)((long)&peVar1->D_dt + uVar3 * 8 + 0xffffffffffffffe8);
              uVar3 = uVar3 + 1;
            } while (uVar3 != 3);
          }
          return;
        }
      }
    }
  }
  __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
               );
}

Assistant:

void ChElementCableANCF::LoadableGetStateBlock_x(int block_offset, ChState& mD) {
    mD.segment(block_offset + 0, 3) = nodes[0]->GetPos().eigen();
    mD.segment(block_offset + 3, 3) = nodes[0]->GetD().eigen();
    mD.segment(block_offset + 6, 3) = nodes[1]->GetPos().eigen();
    mD.segment(block_offset + 9, 3) = nodes[1]->GetD().eigen();
}